

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O2

void __thiscall asmjit::v1_14::RAAssignment::assignWorkIdsFromPhysIds(RAAssignment *this)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  byte *pbVar4;
  uint *puVar5;
  ulong uVar6;
  RegGroup group_00;
  RegGroup group;
  BitWordIterator<unsigned_int> it;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  memset(this->_workToPhysMap,0xff,(ulong)(this->_layout).workCount);
  group_00 = k0;
  do {
    if (group_00 == kPC) {
      return;
    }
    uStack_38._0_4_ = CONCAT13(group_00,(undefined3)uStack_38);
    pbVar4 = RARegCount::operator[]((RARegCount *)this,group_00);
    bVar1 = *pbVar4;
    puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_int,_4UL> *)this->_physToWorkMap,
                        (RegGroup *)((long)&uStack_38 + 3));
    uStack_38 = CONCAT44(*puVar5,(undefined4)uStack_38);
    uVar2 = *puVar5;
    while (uVar2 != 0) {
      uVar3 = Support::BitWordIterator<unsigned_int>::next
                        ((BitWordIterator<unsigned_int> *)((long)&uStack_38 + 4));
      uVar6 = (ulong)this->_physToWorkMap->workIds[uVar3 + bVar1];
      if (uVar6 == 0xffffffff) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/raassignment_p.h"
                   ,0x144,"workId != kWorkNone");
      }
      this->_workToPhysMap[uVar6].physIds[0] = (uint8_t)uVar3;
      uVar2 = uStack_38._4_4_;
    }
    group_00 = group_00 + kVec;
  } while( true );
}

Assistant:

inline void assignWorkIdsFromPhysIds() noexcept {
    memset(_workToPhysMap, uint8_t(BaseReg::kIdBad), WorkToPhysMap::sizeOf(_layout.workCount));

    for (RegGroup group : RegGroupVirtValues{}) {
      uint32_t physBaseIndex = _layout.physIndex[group];
      Support::BitWordIterator<RegMask> it(_physToWorkMap->assigned[group]);

      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t workId = _physToWorkMap->workIds[physBaseIndex + physId];

        ASMJIT_ASSERT(workId != kWorkNone);
        _workToPhysMap->physIds[workId] = uint8_t(physId);
      }
    }
  }